

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_decode_array(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_array_t *output,size_t *offset,
                     int depth)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  int iVar1;
  size_t *__src;
  ulong uVar2;
  void *pvVar3;
  int *in_RCX;
  ulong in_RDI;
  ulong *in_R8;
  undefined4 in_R9D;
  void *newentries;
  int res;
  size_t limit;
  amqp_field_value_t *entries;
  int allocated_entries;
  int num_entries;
  uint32_t arraysize;
  size_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  void *in_stack_ffffffffffffffb8;
  size_t *offset_00;
  int iVar4;
  int iVar5;
  uint in_stack_ffffffffffffffc8;
  int local_4;
  
  iVar5 = 0;
  iVar4 = 0x10;
  encoded_00.len._4_4_ = in_stack_ffffffffffffffb4;
  encoded_00.len._0_4_ = in_stack_ffffffffffffffb0;
  encoded_00.bytes = in_stack_ffffffffffffffb8;
  iVar1 = amqp_decode_32(encoded_00,
                         (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         (uint32_t *)in_stack_ffffffffffffffa0);
  if (iVar1 == 0) {
    local_4 = -2;
  }
  else if (in_RDI < (ulong)in_stack_ffffffffffffffc8 + *in_R8) {
    local_4 = -2;
  }
  else {
    __src = (size_t *)malloc((long)iVar4 * 0x18);
    if (__src == (size_t *)0x0) {
      local_4 = -1;
    }
    else {
      uVar2 = *in_R8 + (ulong)in_stack_ffffffffffffffc8;
      while (*in_R8 < uVar2) {
        offset_00 = __src;
        if (iVar4 <= iVar5) {
          iVar4 = iVar4 << 1;
          in_stack_ffffffffffffffa0 = (size_t *)realloc(__src,(long)iVar4 * 0x18);
          in_stack_ffffffffffffffac = -1;
          offset_00 = in_stack_ffffffffffffffa0;
          if (in_stack_ffffffffffffffa0 == (size_t *)0x0) goto LAB_00107cfb;
        }
        encoded_01.bytes = in_RCX;
        encoded_01.len = (size_t)in_R8;
        in_stack_ffffffffffffffac =
             amqp_decode_field_value
                       (encoded_01,(amqp_pool_t *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                        (amqp_field_value_t *)CONCAT44(iVar5,iVar4),offset_00,(int)(uVar2 >> 0x20));
        __src = offset_00;
        if (in_stack_ffffffffffffffac < 0) goto LAB_00107cfb;
        iVar5 = iVar5 + 1;
      }
      *in_RCX = iVar5;
      pvVar3 = amqp_pool_alloc((amqp_pool_t *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (size_t)in_stack_ffffffffffffffa0);
      *(void **)(in_RCX + 2) = pvVar3;
      if (*(long *)(in_RCX + 2) == 0) {
        if (iVar5 == 0) {
          in_stack_ffffffffffffffac = 0;
        }
        else {
          in_stack_ffffffffffffffac = -1;
        }
      }
      else {
        memcpy(*(void **)(in_RCX + 2),__src,(long)iVar5 * 0x18);
        in_stack_ffffffffffffffac = 0;
      }
LAB_00107cfb:
      free(__src);
      local_4 = in_stack_ffffffffffffffac;
    }
  }
  return local_4;
}

Assistant:

static int amqp_decode_array(amqp_bytes_t encoded, amqp_pool_t *pool,
                             amqp_array_t *output, size_t *offset, int depth) {
  uint32_t arraysize;
  int num_entries = 0;
  int allocated_entries = INITIAL_ARRAY_SIZE;
  amqp_field_value_t *entries;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &arraysize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  if (arraysize + *offset > encoded.len) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_field_value_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + arraysize;
  while (*offset < limit) {
    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries =
          realloc(entries, allocated_entries * sizeof(amqp_field_value_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries], offset,
                                  depth);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries =
      amqp_pool_alloc(pool, num_entries * sizeof(amqp_field_value_t));
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL) {
    if (num_entries == 0) {
      res = AMQP_STATUS_OK;
    } else {
      res = AMQP_STATUS_NO_MEMORY;
    }
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_field_value_t));
  res = AMQP_STATUS_OK;

out:
  free(entries);
  return res;
}